

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::copyAttGroupAttributes
          (TraverseSchema *this,DOMElement *elem,XercesAttGroupInfo *fromAttGroup,
          XercesAttGroupInfo *toAttGroup,ComplexTypeInfo *typeInfo)

{
  uint uri;
  XMLSize_t XVar1;
  DatatypeValidator *pDVar2;
  XMLCh *name;
  bool bVar3;
  SchemaAttDef *pSVar4;
  SchemaAttDef *pSVar5;
  int errorCode;
  XMLSize_t XVar6;
  
  if ((fromAttGroup->fAttributes != (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) &&
     (XVar1 = (fromAttGroup->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).
              fCurCount, XVar1 != 0)) {
    XVar6 = 0;
    do {
      if (&fromAttGroup->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef> ==
          (BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
        pSVar4 = (SchemaAttDef *)0x0;
      }
      else {
        pSVar4 = BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::elementAt
                           (&fromAttGroup->fAttributes->
                             super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>,XVar6);
      }
      pDVar2 = pSVar4->fDatatypeValidator;
      name = pSVar4->fAttName->fLocalPart;
      uri = pSVar4->fAttName->fURIId;
      if (typeInfo == (ComplexTypeInfo *)0x0) {
        bVar3 = XercesAttGroupInfo::containsAttribute(toAttGroup,name,uri);
        if (bVar3) goto LAB_00333ab3;
        if ((pDVar2 != (DatatypeValidator *)0x0) && (pDVar2->fType == ID)) {
          if (toAttGroup->fTypeWithId == true) {
            errorCode = 0x8a;
            goto LAB_00333ad0;
          }
          toAttGroup->fTypeWithId = true;
        }
LAB_00333b63:
        XercesAttGroupInfo::addAttDef(toAttGroup,pSVar4,true);
      }
      else {
        pSVar5 = RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::get
                           (typeInfo->fAttDefs,name,uri);
        if (pSVar5 == (SchemaAttDef *)0x0) {
          if ((pDVar2 != (DatatypeValidator *)0x0) && (pDVar2->fType == ID)) {
            if (typeInfo->fAttWithTypeId == true) {
              errorCode = 0x89;
              goto LAB_00333ad0;
            }
            typeInfo->fAttWithTypeId = true;
          }
          pSVar5 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
          SchemaAttDef::SchemaAttDef(pSVar5,pSVar4);
          ComplexTypeInfo::addAttDef(typeInfo,pSVar5);
          if (pSVar5->fBaseAttDecl == (SchemaAttDef *)0x0) {
            pSVar5->fBaseAttDecl = pSVar4;
          }
          if (toAttGroup != (XercesAttGroupInfo *)0x0) goto LAB_00333b63;
        }
        else {
LAB_00333ab3:
          errorCode = 0x31;
LAB_00333ad0:
          reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",errorCode,name,
                            (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      XVar6 = XVar6 + 1;
    } while (XVar1 != XVar6);
  }
  if (((toAttGroup != (XercesAttGroupInfo *)0x0) &&
      (fromAttGroup->fAnyAttributes != (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0)) &&
     (XVar1 = (fromAttGroup->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).
              fCurCount, XVar1 != 0)) {
    XVar6 = 0;
    do {
      if (&fromAttGroup->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef> ==
          (BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
        pSVar4 = (SchemaAttDef *)0x0;
      }
      else {
        pSVar4 = BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::elementAt
                           (&fromAttGroup->fAnyAttributes->
                             super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>,XVar6);
      }
      XercesAttGroupInfo::addAnyAttDef(toAttGroup,pSVar4,true);
      XVar6 = XVar6 + 1;
    } while (XVar1 != XVar6);
  }
  return;
}

Assistant:

void TraverseSchema::copyAttGroupAttributes(const DOMElement* const elem,
                                            XercesAttGroupInfo* const fromAttGroup,
                                            XercesAttGroupInfo* const toAttGroup,
                                            ComplexTypeInfo* const typeInfo) {

    XMLSize_t attCount = fromAttGroup->attributeCount();

    for (XMLSize_t i=0; i < attCount; i++) {

        SchemaAttDef* attDef = fromAttGroup->attributeAt(i);
        QName* attName = attDef->getAttName();
        const XMLCh* localPart = attName->getLocalPart();
        DatatypeValidator* attDV = attDef->getDatatypeValidator();

        if (typeInfo) {

            if (typeInfo->getAttDef(localPart, attName->getURI())) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAttribute, localPart);
                continue;
            }

            if (attDV && attDV->getType() == DatatypeValidator::ID) {

                if (typeInfo->containsAttWithTypeId()) {

                    reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect5, localPart);
                    continue;
                }

                typeInfo->setAttWithTypeId(true);
            }

            SchemaAttDef* clonedAttDef = new (fGrammarPoolMemoryManager) SchemaAttDef(attDef);
            typeInfo->addAttDef(clonedAttDef);

            if (!clonedAttDef->getBaseAttDecl())
                clonedAttDef->setBaseAttDecl(attDef);

            if (toAttGroup) {
                toAttGroup->addAttDef(attDef, true);
            }
        }
        else {

            if (toAttGroup->containsAttribute(localPart, attName->getURI())) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAttribute, localPart);
                continue;
            }

            if (attDV && attDV->getType() == DatatypeValidator::ID) {

                if (toAttGroup->containsTypeWithId()) {

                    reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttGrpPropCorrect3, localPart);
                    continue;
                }

                toAttGroup->setTypeWithId(true);
            }

            toAttGroup->addAttDef(attDef, true);
        }
    }

    if (toAttGroup) {
        XMLSize_t anyAttCount = fromAttGroup->anyAttributeCount();

        for (XMLSize_t j=0; j < anyAttCount; j++) {
            toAttGroup->addAnyAttDef(fromAttGroup->anyAttributeAt(j), true);
        }
    }
}